

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O0

void __thiscall
FreqTable::FreqTable
          (FreqTable *this,string2stringVec *motif,string *seq,int start,bool normalized,
          int codewordLen,unordered_map<string,_char2double> *pDict)

{
  int in_ECX;
  undefined8 in_RDX;
  string2stringVec *in_RSI;
  string *in_RDI;
  char in_R9B;
  ProbabilityEval *unaff_retaddr;
  unordered_map<string,_char2double> *in_stack_00000010;
  
  ProbabilityEval::ProbabilityEval
            (unaff_retaddr,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0)
             ,in_ECX,in_stack_00000010);
  *(undefined2 *)&in_RDI[6].field_2 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11b184);
  *(undefined4 *)&in_RDI[7].field_2 = 0;
  *(int *)((long)&in_RDI[7].field_2 + 4) = in_ECX;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11b1a9);
  in_RDI[8].field_2._M_local_buf[0] = in_R9B;
  return;
}

Assistant:

FreqTable::FreqTable(string2stringVec& motif, string seq,
                     int start, bool normalized, int codewordLen,
                     robin_hood::unordered_map<string, char2double>& pDict):
                     ProbabilityEval(seq, motif, start, normalized,
                                     codewordLen, &pDict),

    wordEnd(0),
    start(start),
    codewordLen(codewordLen)
    {}